

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classinstance.cpp
# Opt level: O0

void __thiscall ClassInstance::ClassInstance(ClassInstance *this,ClassRuntime *classRuntime)

{
  field_info *pfVar1;
  ulong uVar2;
  Value value_00;
  ValueType VVar3;
  ClassFile *pCVar4;
  ostream *this_00;
  field_info *pfVar5;
  char *pcVar6;
  undefined1 *puVar7;
  Heap *this_01;
  Heap *heap;
  undefined8 local_c8;
  anon_union_8_10_52016fac_for_data aStack_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  Value value;
  string local_a0 [6];
  char fieldType;
  string fieldDescriptor;
  allocator local_79;
  string local_78 [8];
  string fieldName;
  u2 uStack_4e;
  u2 uStack_4c;
  u2 staticAndFinalFlag;
  field_info field;
  int i;
  u2 abstractFlag;
  field_info *fields;
  ClassFile *classFile;
  ClassRuntime *classRuntime_local;
  ClassInstance *this_local;
  
  Object::Object(&this->super_Object);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_objectType_0015ed88;
  this->_classRuntime = classRuntime;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
  ::map(&this->_fields);
  pCVar4 = ClassRuntime::getClassFile(classRuntime);
  pfVar1 = pCVar4->fields;
  if ((pCVar4->access_flags & 0x400) == 0) {
    for (field.attributes._0_4_ = 0; (int)field.attributes < (int)(uint)pCVar4->fields_count;
        field.attributes._0_4_ = (int)field.attributes + 1) {
      pfVar5 = pfVar1 + (int)field.attributes;
      uVar2._0_2_ = pfVar5->access_flags;
      uVar2._2_2_ = pfVar5->name_index;
      uVar2._4_2_ = pfVar5->descriptor_index;
      uVar2._6_2_ = pfVar5->attributes_count;
      if ((uVar2 & 0x18) == 0) {
        pcVar6 = getFormattedConstant(pCVar4->constant_pool,uVar2._2_2_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_78,pcVar6,&local_79);
        std::allocator<char>::~allocator((allocator<char> *)&local_79);
        pcVar6 = getFormattedConstant(pCVar4->constant_pool,uVar2._4_2_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a0,pcVar6,(allocator *)((long)&value.data + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&value.data + 7));
        puVar7 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_a0);
        value.data.longValue._6_1_ = *puVar7;
        VVar3 = value.type;
        switch(value.data.longValue._6_1_) {
        case 0x42:
          uStack_b4 = 1;
          value._0_8_ = value._0_8_ & 0xffffffffffffff00;
          break;
        case 0x43:
          uStack_b4 = 2;
          value._0_8_ = (ulong)(uint7)value._1_7_ << 8;
          break;
        case 0x44:
          uStack_b4 = 7;
          value.printType = BOOLEAN;
          value.type = BOOLEAN;
          break;
        default:
          uStack_b4 = 9;
          value.printType = BOOLEAN;
          value.type = BOOLEAN;
          break;
        case 0x46:
          uStack_b4 = 5;
          value._0_8_ = (ulong)VVar3 << 0x20;
          break;
        case 0x49:
          uStack_b4 = 4;
          value._0_8_ = (ulong)VVar3 << 0x20;
          break;
        case 0x4a:
          uStack_b4 = 6;
          value.printType = BOOLEAN;
          value.type = BOOLEAN;
          break;
        case 0x53:
          uStack_b4 = 3;
          value._0_8_ = value._0_8_ & 0xffffffffffff0000;
          break;
        case 0x5a:
          uStack_b4 = 0;
          value._0_8_ = (ulong)(uint7)value._1_7_ << 8;
        }
        local_c8 = CONCAT44(uStack_b4,uStack_b8);
        aStack_c0 = (anon_union_8_10_52016fac_for_data)value._0_8_;
        std::__cxx11::string::string((string *)&heap,local_78);
        value_00.data.longValue = aStack_c0.longValue;
        value_00.printType = (undefined4)local_c8;
        value_00.type = local_c8._4_4_;
        putValueIntoField(this,value_00,(string *)&heap);
        std::__cxx11::string::~string((string *)&heap);
        std::__cxx11::string::~string(local_a0);
        std::__cxx11::string::~string(local_78);
      }
    }
    this_01 = Heap::getInstance();
    Heap::addObject(this_01,&this->super_Object);
    return;
  }
  this_00 = std::operator<<((ostream *)&std::cerr,"InstantiationError");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

ClassInstance::ClassInstance(ClassRuntime *classRuntime) : _classRuntime(classRuntime) {
    ClassFile *classFile = classRuntime->getClassFile();
    field_info *fields = classFile->fields;
    u2 abstractFlag = 0x0400;
    
    if ((classFile->access_flags & abstractFlag) != 0) {
        // Não pode instanciar se for classe abstrata (i.e., interface)
        cerr << "InstantiationError" << endl;
        exit(1);
    }
    
    for (int i = 0; i < classFile->fields_count; i++) {
        field_info field = fields[i];
        u2 staticAndFinalFlag = 0x0008 | 0x0010;
        
        if ((field.access_flags & staticAndFinalFlag) == 0) { // não estática e não final
            string fieldName = getFormattedConstant(classFile->constant_pool, field.name_index);
            string fieldDescriptor = getFormattedConstant(classFile->constant_pool, field.descriptor_index);
            
            char fieldType = fieldDescriptor[0];
            Value value;
            
            switch (fieldType) {
                case 'B':
                    value.type = ValueType::BYTE;
                    value.data.byteValue = 0;
                    break;
                case 'C':
                    value.type = ValueType::CHAR;
                    value.data.charValue = 0;
                    break;
                case 'D':
                    value.type = ValueType::DOUBLE;
                    value.data.doubleValue = 0;
                    break;
                case 'F':
                    value.type = ValueType::FLOAT;
                    value.data.floatValue = 0;
                    break;
                case 'I':
                    value.type = ValueType::INT;
                    value.data.intValue = 0;
                    break;
                case 'J':
                    value.type = ValueType::LONG;
                    value.data.longValue = 0;
                    break;
                case 'S':
                    value.type = ValueType::SHORT;
                    value.data.shortValue = 0;
                    break;
                case 'Z':
                    value.type = ValueType::BOOLEAN;
                    value.data.charValue = false;
                    break;
                default:
                    value.type = ValueType::REFERENCE;
                    value.data.object = NULL;
            }
            
            putValueIntoField(value, fieldName);
        }
    }
    
    // quando um objeto é criado, ele precisa ser armazenado na Heap
    Heap &heap = Heap::getInstance();
    heap.addObject(this);
}